

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O1

string * __thiscall
leveldb::Histogram::ToString_abi_cxx11_(string *__return_storage_ptr__,Histogram *this)

{
  int b;
  long lVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  char buf [200];
  char local_f8 [200];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  dVar2 = this->num_;
  dVar5 = this->sum_;
  dVar4 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar4 = (this->sum_squares_ * dVar2 - dVar5 * dVar5) / (dVar2 * dVar2);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  snprintf(local_f8,200,"Count: %.0f  Average: %.4f  StdDev: %.2f\n",dVar2,
           ~-(uint)(dVar2 == 0.0) & SUB84(dVar5 / dVar2,0),dVar4);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  dVar2 = this->num_;
  dVar5 = this->min_;
  dVar4 = Percentile(this,50.0);
  snprintf(local_f8,200,"Min: %.4f  Median: %.4f  Max: %.4f\n",
           ~-(ulong)(dVar2 == 0.0) & (ulong)dVar5,SUB84(dVar4,0),this->max_);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  dVar2 = 100.0 / this->num_;
  lVar1 = 0;
  dVar5 = 0.0;
  do {
    dVar4 = this->buckets_[lVar1];
    if (0.0 < dVar4) {
      if (lVar1 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (&DAT_00123038)[lVar1];
      }
      dVar5 = dVar5 + dVar4;
      snprintf(local_f8,200,"[ %7.0f, %7.0f ) %7.0f %7.3f%% %7.3f%% ",uVar3,
               (int)(&kBucketLimit)[lVar1],dVar4,dVar2 * dVar4,dVar2 * dVar5);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 (char)(int)((this->buckets_[lVar1] / this->num_) * 20.0 + 0.5));
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x9a);
  return __return_storage_ptr__;
}

Assistant:

std::string Histogram::ToString() const {
  std::string r;
  char buf[200];
  std::snprintf(buf, sizeof(buf), "Count: %.0f  Average: %.4f  StdDev: %.2f\n",
                num_, Average(), StandardDeviation());
  r.append(buf);
  std::snprintf(buf, sizeof(buf), "Min: %.4f  Median: %.4f  Max: %.4f\n",
                (num_ == 0.0 ? 0.0 : min_), Median(), max_);
  r.append(buf);
  r.append("------------------------------------------------------\n");
  const double mult = 100.0 / num_;
  double sum = 0;
  for (int b = 0; b < kNumBuckets; b++) {
    if (buckets_[b] <= 0.0) continue;
    sum += buckets_[b];
    std::snprintf(buf, sizeof(buf), "[ %7.0f, %7.0f ) %7.0f %7.3f%% %7.3f%% ",
                  ((b == 0) ? 0.0 : kBucketLimit[b - 1]),  // left
                  kBucketLimit[b],                         // right
                  buckets_[b],                             // count
                  mult * buckets_[b],                      // percentage
                  mult * sum);  // cumulative percentage
    r.append(buf);

    // Add hash marks based on percentage; 20 marks for 100%.
    int marks = static_cast<int>(20 * (buckets_[b] / num_) + 0.5);
    r.append(marks, '#');
    r.push_back('\n');
  }
  return r;
}